

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int Curl_dyn_vprintf(dynbuf *dyn,char *format,__va_list_tag *ap_save)

{
  int iVar1;
  asprintf info;
  dynbuf *local_18;
  char local_10;
  
  local_10 = '\0';
  local_18 = dyn;
  formatf(&local_18,alloc_addbyter,format,ap_save);
  if (local_10 == '\0') {
    iVar1 = 0;
  }
  else {
    Curl_dyn_free(local_18);
    iVar1 = (int)local_10;
  }
  return iVar1;
}

Assistant:

int Curl_dyn_vprintf(struct dynbuf *dyn, const char *format, va_list ap_save)
{
  struct asprintf info;
  info.b = dyn;
  info.merr = MERR_OK;

  (void)formatf(&info, alloc_addbyter, format, ap_save);
  if(info.merr) {
    Curl_dyn_free(info.b);
    return info.merr;
  }
  return 0;
}